

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int ret;
  Exception *this_00;
  
  ret = sqlite3_bind_text((this->mStmtPtr).mpStmt,__fd,(char *)__addr,-1,
                          (_func_void_void_ptr *)0xffffffffffffffff);
  if (ret == 0) {
    return 0x1842c0;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(this->mStmtPtr).mpSQLite,ret);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Statement::bind(const int aIndex, const char* apValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, apValue, -1, SQLITE_TRANSIENT);
    check(ret);
}